

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::AbstractSocketWriter::SendLn
          (AbstractSocketWriter *this,string *message)

{
  long in_FS_OFFSET;
  string *message_local;
  AbstractSocketWriter *this_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this_local,
                 message,"\n");
  (*this->_vptr_AbstractSocketWriter[2])
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this_local);
  std::__cxx11::string::~string((string *)&this_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendLn(const string& message) {
					Send(message + "\n");
				}